

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O1

RK_U32 __thiscall MppBufferService::get_group_id(MppBufferService *this)

{
  hlist_node *phVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  hlist_node ***ppphVar4;
  bool bVar5;
  
  RVar2 = 0;
  if (get_group_id()::overflowed == '\0') {
    RVar2 = this->group_id;
    if (RVar2 == 0) {
      get_group_id()::overflowed = '\x01';
      RVar2 = 0;
      RVar3 = 1;
    }
    else {
      RVar3 = RVar2 + 1;
    }
    this->group_id = RVar3;
  }
  if (get_group_id()::overflowed == '\x01') {
    RVar3 = this->group_id;
    do {
      RVar2 = RVar3;
      phVar1 = this->mHashGroup[RVar2 * 0x61c88647 >> 0x18].first;
      bVar5 = phVar1 == (hlist_node *)0x0;
      if (!bVar5) {
        do {
          ppphVar4 = &phVar1[-0xd].pprev;
          if (*(RK_U32 *)((long)&phVar1[-9].pprev + 4) == RVar2) goto LAB_0015bda9;
          phVar1 = phVar1->next;
        } while (phVar1 != (hlist_node *)0x0);
        ppphVar4 = (hlist_node ***)0x0;
LAB_0015bda9:
        bVar5 = ppphVar4 == (hlist_node ***)0x0;
      }
      RVar3 = RVar2 + 1;
    } while (!bVar5);
    this->group_id = RVar2 + 1;
  }
  this->group_count = this->group_count + 1;
  return RVar2;
}

Assistant:

RK_U32 MppBufferService::get_group_id()
{
    RK_U32 id = 0;
    static RK_U32 overflowed = 0;

    if (!overflowed) {
        /* avoid 0 group id */
        if (group_id)
            id = group_id++;
        else {
            overflowed = 1;
            group_id = 1;
        }
    }

    if (overflowed) {
        id = group_id++;

        /* when it is overflow avoid the used id */
        while (get_group_by_id(id))
            id = group_id++;
    }

    group_count++;

    return id;
}